

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_log.cxx
# Opt level: O1

void __thiscall xray_re::xr_log::diagnostic(xr_log *this,char *format,__va_list_tag *ap)

{
  char *__s;
  uint uVar1;
  size_t sVar2;
  
  uVar1 = vsnprintf(this->m_buf_p,this->m_buf_size,format,ap);
  if ((int)uVar1 < 0) {
    return;
  }
  if (this->m_log != (xr_writer *)0x0) {
    xr_writer::w_s(this->m_log,this->m_buf);
  }
  this->m_buf_p[uVar1] = '\n';
  this->m_buf_p[(ulong)uVar1 + 1] = '\0';
  __s = this->m_buf_p;
  if (__s != (char *)0x0) {
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,__s,sVar2);
    return;
  }
  std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x267558);
  return;
}

Assistant:

void xr_log::diagnostic(const char* format, va_list ap)
{
#if defined(_MSC_VER) && _MSC_VER >= 1400
	int n = vsprintf_s(m_buf_p, m_buf_size, format, ap);
#else
	int n = vsnprintf(m_buf_p, m_buf_size, format, ap);
#endif
	if (n >= 0) {
		if (m_log)
			m_log->w_s(m_buf);
		// m_buf_size initialization in constructor assures
		// there is space for extra '\0'.
		m_buf_p[n] = '\n';
		m_buf_p[n + 1] = '\0';
		// exclude prefix for the file output
#	if (MAYA_API_VERSION >= 201300) 
		fputs(m_buf_p, stderr);
#	else
		std::cerr << m_buf_p;
#	endif
#if defined(DEBUG) && defined(WIN32)
		OutputDebugString(m_buf_p);
#endif
	}
}